

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  uint *puVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  undefined2 uVar6;
  undefined2 uVar7;
  undefined2 uVar9;
  stbtt__point sVar4;
  stbtt__point sVar5;
  undefined4 uVar8;
  stbtt_uint8 sVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  ushort uVar15;
  int iVar16;
  undefined4 uVar17;
  undefined1 uVar21;
  ImFontAtlas *pIVar18;
  ImFont *pIVar19;
  stbtt_uint8 *data;
  undefined6 uVar22;
  undefined4 uVar23;
  stbtt__active_edge *psVar20;
  stbrp_node *psVar24;
  short sVar25;
  short sVar26;
  undefined1 auVar27 [15];
  undefined1 auVar28 [14];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined4 uVar36;
  undefined4 uVar37;
  undefined1 auVar38 [15];
  unkuint9 Var39;
  undefined1 auVar40 [15];
  undefined1 auVar41 [13];
  undefined1 auVar42 [14];
  undefined1 auVar43 [12];
  undefined1 auVar44 [15];
  unkbyte10 Var45;
  uint6 uVar46;
  stbrp_rect *psVar47;
  stbtt_uint32 sVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  uint uVar58;
  stbtt__active_edge *z;
  stbtt_uint32 sVar48;
  stbtt_uint32 sVar49;
  stbtt_uint32 sVar50;
  stbtt_uint32 sVar51;
  stbtt_uint32 sVar52;
  stbtt_uint32 sVar53;
  ImFontBuildSrcData *pIVar59;
  ImFontConfig *pIVar60;
  ImFont **ppIVar61;
  long lVar62;
  ImFontBuildDstData *pIVar63;
  stbrp_rect *psVar64;
  stbtt_packedchar *psVar65;
  int *piVar66;
  stbrp_context *ptr;
  uchar *puVar67;
  void *ptr_00;
  stbtt__edge *p;
  stbtt__buf *scanline;
  undefined8 *puVar68;
  stbtt__active_edge *psVar69;
  stbtt_uint32 *psVar70;
  ushort uVar71;
  ushort uVar72;
  uint uVar73;
  ulong uVar74;
  stbtt__active_edge *psVar75;
  stbtt__buf *psVar76;
  ImWchar *src_range;
  ImWchar *pIVar77;
  float fVar78;
  ImU32 *it;
  ushort *puVar79;
  uint *puVar80;
  stbtt__active_edge *psVar81;
  uchar *puVar82;
  byte *pbVar83;
  ImVector<ImFontConfig> *pIVar84;
  int output_i;
  int iVar85;
  uint uVar86;
  stbtt__edge *psVar87;
  long lVar88;
  ulong uVar89;
  ulong uVar90;
  uchar *puVar91;
  ulong uVar92;
  byte *pbVar93;
  int iVar94;
  int iVar95;
  long lVar96;
  stbtt__edge *psVar97;
  ImBitVector *this;
  ImFontAtlas *pIVar98;
  ImU32 bit_n;
  uint uVar99;
  ulong uVar100;
  long lVar101;
  uchar *puVar102;
  bool bVar103;
  bool bVar104;
  char cVar109;
  float sum;
  float fVar105;
  float fVar106;
  char cVar110;
  undefined4 uVar111;
  undefined4 uVar113;
  undefined1 extraout_var [12];
  ushort uVar112;
  undefined4 uVar114;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar118;
  undefined1 auVar119 [16];
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 in_XMM3 [16];
  undefined1 auVar123 [16];
  float fVar124;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar127;
  float fVar128;
  stbtt__buf sVar129;
  float y0_2;
  int local_498;
  int y1;
  ulong local_490;
  stbtt_uint32 charstrings;
  ImVector<ImFontConfig> *local_480;
  ImFontAtlas *local_478;
  float local_46c;
  ImVector<ImFontBuildSrcData> src_tmp_array;
  uint local_448;
  stbrp_node *local_430;
  stbtt__point *local_420;
  stbtt_uint32 fdarrayoff;
  undefined4 uStack_414;
  float local_40c;
  ulong local_408;
  float *local_400;
  int local_3f8;
  int local_3f4;
  int local_3f0;
  float local_3ec;
  ImVector<stbrp_rect> buf_rects;
  ImVector<ImFontBuildDstData> dst_tmp_array;
  undefined8 *local_3c0;
  ImVector<stbtt_packedchar> buf_packedchars;
  int local_388;
  int y0_1;
  int x0_1;
  int iy0;
  stbrp_context *local_350;
  ulong local_348;
  long local_340;
  long local_338;
  stbtt__edge *local_330;
  ulong local_328;
  ulong local_320;
  undefined1 local_318 [16];
  ImFontConfig *local_300;
  ulong local_2f8;
  uchar *local_2f0;
  stbrp_rect *local_2e8;
  long local_2e0;
  long local_2d8;
  size_t local_2d0;
  size_t local_2c8;
  stbtt_packedchar *local_2c0;
  ulong local_2b8;
  int local_2b0;
  int x1_1;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  float local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  stbtt__buf b;
  
  if ((atlas->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x79d,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  src_tmp_array.Size = 0;
  src_tmp_array.Capacity = 0;
  src_tmp_array.Data = (ImFontBuildSrcData *)0x0;
  dst_tmp_array.Size = 0;
  dst_tmp_array.Capacity = 0;
  dst_tmp_array.Data = (ImFontBuildDstData *)0x0;
  ImVector<ImFontBuildSrcData>::resize(&src_tmp_array,(atlas->ConfigData).Size);
  ImVector<ImFontBuildDstData>::resize(&dst_tmp_array,(atlas->Fonts).Size);
  local_480 = &atlas->ConfigData;
  memset(src_tmp_array.Data,0,(long)src_tmp_array.Size * 0x110);
  memset(dst_tmp_array.Data,0,(long)dst_tmp_array.Size << 5);
  iVar55 = 0;
  local_478 = atlas;
  while (pIVar98 = local_478, pIVar84 = local_480, iVar16 = local_480->Size, local_3f8 = iVar55,
        iVar55 < iVar16) {
    pIVar59 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar55);
    pIVar60 = ImVector<ImFontConfig>::operator[](pIVar84,iVar55);
    if ((pIVar60->DstFont == (ImFont *)0x0) ||
       (pIVar18 = pIVar60->DstFont->ContainerAtlas,
       pIVar18 != pIVar98 && pIVar18 != (ImFontAtlas *)0x0)) {
      __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                    ,0x7b5,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    pIVar59->DstIndex = -1;
    iVar85 = 0;
    iVar55 = -1;
    while ((iVar85 < (atlas->Fonts).Size && (iVar55 == -1))) {
      pIVar19 = pIVar60->DstFont;
      ppIVar61 = ImVector<ImFont_*>::operator[](&atlas->Fonts,iVar85);
      if (pIVar19 == *ppIVar61) {
        pIVar59->DstIndex = iVar85;
        iVar55 = iVar85;
      }
      else {
        iVar55 = pIVar59->DstIndex;
      }
      iVar85 = iVar85 + 1;
    }
    if (iVar55 == -1) {
      __assert_fail("src_tmp.DstIndex != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                    ,0x7bc,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    data = (stbtt_uint8 *)pIVar60->FontData;
    iVar55 = pIVar60->FontNo;
    sVar10 = *data;
    if (sVar10 == '\0') {
      if (data[1] != '\x01') goto LAB_00150372;
LAB_0014fe53:
      if ((data[2] != '\0') || (data[3] != '\0')) goto LAB_00150372;
LAB_0014fe6b:
      sVar54 = -(uint)(iVar55 != 0);
    }
    else {
      if (sVar10 != 't') {
        if (sVar10 != 'O') {
          if ((sVar10 != '1') || (data[1] != '\0')) goto LAB_00150372;
          goto LAB_0014fe53;
        }
        if (((data[1] != 'T') || (data[2] != 'T')) || (data[3] != 'O')) goto LAB_00150372;
        goto LAB_0014fe6b;
      }
      sVar10 = data[1];
      if (sVar10 == 'r') {
        if ((data[2] != 'u') || (data[3] != 'e')) goto LAB_00150372;
        goto LAB_0014fe6b;
      }
      if (sVar10 != 't') {
        if (((sVar10 != 'y') || (data[2] != 'p')) || (data[3] != '1')) goto LAB_00150372;
        goto LAB_0014fe6b;
      }
      if (((data[2] != 'c') || (data[3] != 'f')) ||
         (((sVar54 = ttULONG(data + 4), sVar54 != 0x20000 && (sVar54 != 0x10000)) ||
          (uVar86 = *(uint *)(data + 8),
          (int)(uVar86 >> 0x18 | (uVar86 & 0xff0000) >> 8 | (uVar86 & 0xff00) << 8 | uVar86 << 0x18)
          <= iVar55)))) goto LAB_00150372;
      sVar54 = ttULONG(data + (long)iVar55 * 4 + 0xc);
    }
    if ((int)sVar54 < 0) {
LAB_00150372:
      __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                    ,0x7c2,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    (pIVar59->FontInfo).data = data;
    (pIVar59->FontInfo).fontstart = sVar54;
    (pIVar59->FontInfo).cff.data = (uchar *)0x0;
    (pIVar59->FontInfo).cff.cursor = 0;
    (pIVar59->FontInfo).cff.size = 0;
    sVar48 = stbtt__find_table(data,sVar54,"cmap");
    sVar49 = stbtt__find_table(data,sVar54,"loca");
    local_490 = CONCAT44(local_490._4_4_,sVar49);
    (pIVar59->FontInfo).loca = sVar49;
    sVar49 = stbtt__find_table(data,sVar54,"head");
    (pIVar59->FontInfo).head = sVar49;
    sVar50 = stbtt__find_table(data,sVar54,"glyf");
    (pIVar59->FontInfo).glyf = sVar50;
    sVar51 = stbtt__find_table(data,sVar54,"hhea");
    (pIVar59->FontInfo).hhea = sVar51;
    sVar52 = stbtt__find_table(data,sVar54,"hmtx");
    (pIVar59->FontInfo).hmtx = sVar52;
    sVar53 = stbtt__find_table(data,sVar54,"kern");
    (pIVar59->FontInfo).kern = sVar53;
    sVar53 = stbtt__find_table(data,sVar54,"GPOS");
    (pIVar59->FontInfo).gpos = sVar53;
    if ((((sVar48 == 0) || (sVar49 == 0)) || (sVar51 == 0)) || (sVar52 == 0)) goto LAB_00152657;
    if (sVar50 == 0) {
      _charstrings = (stbtt__active_edge *)((ulong)_charstrings & 0xffffffff00000000);
      fdarrayoff = 0;
      buf_packedchars.Size = 2;
      y1 = 0;
      sVar49 = stbtt__find_table(data,sVar54,"CFF ");
      if (sVar49 == 0) goto LAB_00152657;
      (pIVar59->FontInfo).fdselect.data = (uchar *)0x0;
      (pIVar59->FontInfo).fdselect.cursor = 0;
      (pIVar59->FontInfo).fdselect.size = 0;
      (pIVar59->FontInfo).fontdicts.data = (uchar *)0x0;
      (pIVar59->FontInfo).fontdicts.cursor = 0;
      (pIVar59->FontInfo).fontdicts.size = 0;
      (pIVar59->FontInfo).cff.data = data + sVar49;
      (pIVar59->FontInfo).cff.cursor = 0;
      (pIVar59->FontInfo).cff.size = 0x20000000;
      puVar67 = (pIVar59->FontInfo).cff.data;
      uVar36 = (pIVar59->FontInfo).cff.cursor;
      uVar37 = (pIVar59->FontInfo).cff.size;
      b.data._0_4_ = (int)puVar67;
      b.data._4_4_ = (undefined4)((ulong)puVar67 >> 0x20);
      b.cursor = uVar36;
      b.size = uVar37;
      stbtt__buf_skip(&b,2);
      lVar62 = (long)b.cursor;
      uVar86 = 0;
      if (b.cursor < b.size) {
        b.cursor = b.cursor + 1;
        uVar86 = (uint)*(byte *)(CONCAT44(b.data._4_4_,(int)b.data) + lVar62);
      }
      stbtt__buf_seek(&b,uVar86);
      stbtt__cff_get_index(&b);
      sVar129 = stbtt__cff_get_index(&b);
      buf_rects = (ImVector<stbrp_rect>)stbtt__cff_index_get(sVar129,0);
      stbtt__cff_get_index(&b);
      sVar129 = stbtt__cff_get_index(&b);
      (pIVar59->FontInfo).gsubrs = sVar129;
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x11,1,&charstrings);
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x106,1,(stbtt_uint32 *)&buf_packedchars);
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x124,1,&fdarrayoff);
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x125,1,(stbtt_uint32 *)&y1);
      sVar129.data._4_4_ = b.data._4_4_;
      sVar129.data._0_4_ = (int)b.data;
      sVar129.cursor = b.cursor;
      sVar129.size = b.size;
      sVar129 = stbtt__get_subrs(sVar129,(stbtt__buf)buf_rects);
      iVar55 = y1;
      (pIVar59->FontInfo).subrs = sVar129;
      if ((buf_packedchars.Size != 2) || (sVar49 = charstrings, charstrings == 0))
      goto LAB_00152657;
      if (fdarrayoff != 0) {
        if (y1 == 0) goto LAB_00152657;
        stbtt__buf_seek(&b,fdarrayoff);
        sVar129 = stbtt__cff_get_index(&b);
        (pIVar59->FontInfo).fontdicts = sVar129;
        sVar129 = stbtt__buf_range(&b,iVar55,b.size - iVar55);
        (pIVar59->FontInfo).fdselect = sVar129;
      }
      stbtt__buf_seek(&b,sVar49);
      sVar129 = stbtt__cff_get_index(&b);
      (pIVar59->FontInfo).charstrings = sVar129;
    }
    else if ((float)local_490 == 0.0) goto LAB_00152657;
    sVar54 = stbtt__find_table(data,sVar54,"maxp");
    if (sVar54 == 0) {
      uVar86 = 0xffff;
    }
    else {
      uVar86 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar54 + 4) << 8 |
                             *(ushort *)(data + (ulong)sVar54 + 4) >> 8);
    }
    (pIVar59->FontInfo).numGlyphs = uVar86;
    uVar71 = *(ushort *)(data + (ulong)sVar48 + 2);
    (pIVar59->FontInfo).index_map = 0;
    uVar100 = (ulong)(ushort)(uVar71 << 8 | uVar71 >> 8);
    uVar86 = sVar48 + 4;
    iVar55 = 0;
    while (bVar103 = uVar100 != 0, uVar100 = uVar100 - 1, bVar103) {
      uVar71 = *(ushort *)(data + uVar86) << 8 | *(ushort *)(data + uVar86) >> 8;
      if ((uVar71 == 0) ||
         ((uVar71 == 3 &&
          ((uVar71 = *(ushort *)(data + (ulong)uVar86 + 2) << 8 |
                     *(ushort *)(data + (ulong)uVar86 + 2) >> 8, uVar71 == 10 || (uVar71 == 1))))))
      {
        sVar54 = ttULONG(data + (ulong)uVar86 + 4);
        iVar55 = sVar54 + sVar48;
        (pIVar59->FontInfo).index_map = iVar55;
      }
      uVar86 = uVar86 + 8;
    }
    if (iVar55 == 0) goto LAB_00152657;
    (pIVar59->FontInfo).indexToLocFormat =
         (uint)(ushort)(*(ushort *)(data + (long)(pIVar59->FontInfo).head + 0x32) << 8 |
                       *(ushort *)(data + (long)(pIVar59->FontInfo).head + 0x32) >> 8);
    pIVar63 = ImVector<ImFontBuildDstData>::operator[](&dst_tmp_array,pIVar59->DstIndex);
    pIVar77 = pIVar60->GlyphRanges;
    if (pIVar77 == (ImWchar *)0x0) {
      pIVar77 = ImFontAtlas::GetGlyphRangesDefault::ranges;
    }
    pIVar59->SrcRanges = pIVar77;
    uVar86 = pIVar59->GlyphsHighest;
    for (; (*pIVar77 != 0 && (uVar71 = pIVar77[1], uVar71 != 0)); pIVar77 = pIVar77 + 2) {
      if ((int)uVar86 <= (int)(uint)uVar71) {
        uVar86 = (uint)uVar71;
      }
      pIVar59->GlyphsHighest = uVar86;
    }
    pIVar63->SrcCount = pIVar63->SrcCount + 1;
    if ((int)uVar86 < pIVar63->GlyphsHighest) {
      uVar86 = pIVar63->GlyphsHighest;
    }
    pIVar63->GlyphsHighest = uVar86;
    iVar55 = local_3f8 + 1;
  }
  iVar55 = 0;
  for (iVar85 = 0; iVar85 < src_tmp_array.Size; iVar85 = iVar85 + 1) {
    pIVar59 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar85);
    pIVar63 = ImVector<ImFontBuildDstData>::operator[](&dst_tmp_array,pIVar59->DstIndex);
    ImBitVector::Create(&pIVar59->GlyphsSet,pIVar59->GlyphsHighest + 1);
    this = &pIVar63->GlyphsSet;
    if ((pIVar63->GlyphsSet).Storage.Size == 0) {
      ImBitVector::Create(this,pIVar63->GlyphsHighest + 1);
    }
    for (puVar79 = pIVar59->SrcRanges;
        (uVar86 = (uint)*puVar79, *puVar79 != 0 && (uVar71 = puVar79[1], uVar71 != 0));
        puVar79 = puVar79 + 2) {
      for (; uVar86 <= uVar71; uVar86 = uVar86 + 1) {
        bVar103 = ImBitVector::TestBit(this,uVar86);
        if ((!bVar103) && (iVar56 = stbtt_FindGlyphIndex(&pIVar59->FontInfo,uVar86), iVar56 != 0)) {
          pIVar59->GlyphsCount = pIVar59->GlyphsCount + 1;
          pIVar63->GlyphsCount = pIVar63->GlyphsCount + 1;
          ImBitVector::SetBit(&pIVar59->GlyphsSet,uVar86);
          ImBitVector::SetBit(this,uVar86);
          iVar55 = iVar55 + 1;
        }
        uVar71 = puVar79[1];
      }
    }
  }
  iVar85 = 0;
  while (pIVar98 = local_478, iVar85 < src_tmp_array.Size) {
    pIVar59 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar85);
    ImVector<int>::reserve(&pIVar59->GlyphsList,pIVar59->GlyphsCount);
    puVar80 = (pIVar59->GlyphsSet).Storage.Data;
    puVar1 = puVar80 + (pIVar59->GlyphsSet).Storage.Size;
    iVar56 = 0;
    for (; puVar80 < puVar1; puVar80 = puVar80 + 1) {
      uVar86 = *puVar80;
      if (uVar86 != 0) {
        for (uVar99 = 0; uVar99 != 0x20; uVar99 = uVar99 + 1) {
          if ((uVar86 >> (uVar99 & 0x1f) & 1) != 0) {
            b.data._0_4_ = uVar99 + iVar56;
            ImVector<int>::push_back(&pIVar59->GlyphsList,(int *)&b);
          }
        }
      }
      iVar56 = iVar56 + 0x20;
    }
    ImVector<unsigned_int>::clear(&(pIVar59->GlyphsSet).Storage);
    iVar85 = iVar85 + 1;
    if ((pIVar59->GlyphsList).Size != pIVar59->GlyphsCount) {
      __assert_fail("src_tmp.GlyphsList.Size == src_tmp.GlyphsCount",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                    ,0x7f1,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
  }
  for (iVar85 = 0; iVar85 < dst_tmp_array.Size; iVar85 = iVar85 + 1) {
    pIVar63 = ImVector<ImFontBuildDstData>::operator[](&dst_tmp_array,iVar85);
    ImVector<unsigned_int>::clear(&(pIVar63->GlyphsSet).Storage);
  }
  ImVector<ImFontBuildDstData>::clear(&dst_tmp_array);
  buf_rects = (ImVector<stbrp_rect>)ZEXT816(0);
  buf_packedchars.Size = 0;
  buf_packedchars.Capacity = 0;
  buf_packedchars.Data = (stbtt_packedchar *)0x0;
  ImVector<stbrp_rect>::resize(&buf_rects,iVar55);
  pIVar84 = local_480;
  ImVector<stbtt_packedchar>::resize(&buf_packedchars,iVar55);
  uVar100 = 0;
  memset(buf_rects.Data,0,(long)buf_rects.Size << 4);
  memset(buf_packedchars.Data,0,(long)buf_packedchars.Size * 0x1c);
  iVar85 = 0;
  iVar55 = 0;
  iVar56 = 0;
  while( true ) {
    iVar57 = (int)uVar100;
    if (src_tmp_array.Size <= iVar57) break;
    pIVar59 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar57);
    if (pIVar59->GlyphsCount != 0) {
      psVar64 = ImVector<stbrp_rect>::operator[](&buf_rects,iVar55);
      pIVar59->Rects = psVar64;
      psVar65 = ImVector<stbtt_packedchar>::operator[](&buf_packedchars,iVar85);
      pIVar59->PackedChars = psVar65;
      iVar95 = pIVar59->GlyphsCount;
      pIVar60 = ImVector<ImFontConfig>::operator[](pIVar84,iVar57);
      fVar105 = pIVar60->SizePixels;
      (pIVar59->PackRange).font_size = fVar105;
      (pIVar59->PackRange).first_unicode_codepoint_in_range = 0;
      (pIVar59->PackRange).array_of_unicode_codepoints = (pIVar59->GlyphsList).Data;
      iVar57 = (pIVar59->GlyphsList).Size;
      (pIVar59->PackRange).num_chars = iVar57;
      (pIVar59->PackRange).chardata_for_range = pIVar59->PackedChars;
      (pIVar59->PackRange).h_oversample = (uchar)pIVar60->OversampleH;
      (pIVar59->PackRange).v_oversample = (uchar)pIVar60->OversampleV;
      local_490 = uVar100;
      if (fVar105 <= 0.0) {
        uVar71 = *(ushort *)((pIVar59->FontInfo).data + (long)(pIVar59->FontInfo).head + 0x12);
        fVar105 = -fVar105 / (float)(ushort)(uVar71 << 8 | uVar71 >> 8);
      }
      else {
        fVar105 = stbtt_ScaleForPixelHeight(&pIVar59->FontInfo,fVar105);
      }
      iVar55 = iVar55 + iVar95;
      iVar85 = iVar85 + iVar95;
      iVar95 = pIVar98->TexGlyphPadding;
      lVar62 = 6;
      for (lVar101 = 0; pIVar84 = local_480, pIVar98 = local_478, uVar100 = local_490,
          lVar101 < iVar57; lVar101 = lVar101 + 1) {
        piVar66 = ImVector<int>::operator[](&pIVar59->GlyphsList,(int)lVar101);
        iVar57 = stbtt_FindGlyphIndex(&pIVar59->FontInfo,*piVar66);
        if (iVar57 == 0) {
          __assert_fail("glyph_index_in_font != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                        ,0x820,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
        }
        stbtt_GetGlyphBitmapBoxSubpixel
                  (&pIVar59->FontInfo,iVar57,(float)pIVar60->OversampleH * fVar105,
                   (float)pIVar60->OversampleV * fVar105,fVar105,in_XMM3._0_4_,(int *)&b,
                   (int *)&charstrings,(int *)&fdarrayoff,&y1);
        uVar86 = (pIVar60->OversampleH + ((fdarrayoff + iVar95) - (int)b.data)) - 1;
        psVar64 = pIVar59->Rects;
        *(short *)((long)psVar64 + lVar62 + -2) = (short)uVar86;
        uVar99 = (pIVar60->OversampleV + ((y1 + iVar95) - charstrings)) - 1;
        *(short *)((long)&psVar64->id + lVar62) = (short)uVar99;
        iVar56 = iVar56 + (uVar99 & 0xffff) * (uVar86 & 0xffff);
        iVar57 = (pIVar59->GlyphsList).Size;
        lVar62 = lVar62 + 0x10;
      }
    }
    uVar100 = (ulong)((int)uVar100 + 1);
  }
  pIVar98->TexHeight = 0;
  local_498 = pIVar98->TexDesiredWidth;
  if (local_498 < 1) {
    iVar55 = (int)SQRT((float)iVar56);
    local_498 = 0x1000;
    if ((iVar55 < 0xb33) && (local_498 = 0x800, iVar55 < 0x599)) {
      local_498 = (uint)(0x2cb < iVar55) * 0x200 + 0x200;
    }
  }
  pIVar98->TexWidth = local_498;
  uVar86 = pIVar98->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar55 = local_498 - uVar86;
  local_430 = (stbrp_node *)ImGui::MemAlloc((long)iVar55 << 4);
  if ((ptr == (stbrp_context *)0x0) || (local_430 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (local_430 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_430);
    }
    local_430 = (stbrp_node *)0x0;
    uVar86 = 0;
    local_498 = 0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    if (((int)uVar86 < -0x7fff) || (0xffff < iVar55)) {
      __assert_fail("width <= 0xffff && height <= 0xffff",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_rectpack.h"
                    ,0x10a,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
    }
    uVar99 = iVar55 - 1;
    uVar92 = 0;
    psVar24 = local_430;
    uVar100 = uVar92;
    if (0 < (int)uVar99) {
      uVar92 = (ulong)uVar99;
      uVar100 = uVar92;
    }
    while( true ) {
      bVar103 = uVar92 == 0;
      uVar92 = uVar92 - 1;
      if (bVar103) break;
      psVar24->next = psVar24 + 1;
      psVar24 = psVar24 + 1;
    }
    local_430[uVar100].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = local_430;
    ptr->active_head = ptr->extra;
    ptr->width = iVar55;
    ptr->height = 0x8000 - uVar86;
    ptr->num_nodes = iVar55;
    ptr->align = (int)(uVar99 + iVar55) / iVar55;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)iVar55;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  local_350 = ptr;
  ImFontAtlasBuildPackCustomRects(pIVar98,ptr);
  for (iVar55 = 0; pIVar84 = local_480, iVar55 < src_tmp_array.Size; iVar55 = iVar55 + 1) {
    pIVar59 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar55);
    if (pIVar59->GlyphsCount != 0) {
      stbrp_pack_rects(local_350,pIVar59->Rects,pIVar59->GlyphsCount);
      psVar64 = pIVar59->Rects;
      uVar100 = (ulong)(uint)pIVar59->GlyphsCount;
      if (pIVar59->GlyphsCount < 1) {
        uVar100 = 0;
      }
      for (lVar62 = 0; uVar100 * 0x10 != lVar62; lVar62 = lVar62 + 0x10) {
        if (*(int *)((long)&psVar64->was_packed + lVar62) != 0) {
          iVar85 = (uint)*(ushort *)((long)&psVar64->h + lVar62) +
                   (uint)*(ushort *)((long)&psVar64->y + lVar62);
          if (iVar85 < pIVar98->TexHeight) {
            iVar85 = pIVar98->TexHeight;
          }
          pIVar98->TexHeight = iVar85;
        }
      }
    }
  }
  uVar99 = pIVar98->TexHeight;
  if ((pIVar98->Flags & 1) == 0) {
    uVar99 = (int)(uVar99 - 1) >> 1 | uVar99 - 1;
    uVar99 = (int)uVar99 >> 2 | uVar99;
    uVar99 = (int)uVar99 >> 4 | uVar99;
    uVar99 = (int)uVar99 >> 8 | uVar99;
    uVar99 = (int)uVar99 >> 0x10 | uVar99;
  }
  iVar55 = uVar99 + 1;
  pIVar98->TexHeight = iVar55;
  auVar116._0_4_ = (float)pIVar98->TexWidth;
  auVar116._4_4_ = (float)iVar55;
  auVar116._8_8_ = 0;
  auVar116 = divps(_DAT_00178c10,auVar116);
  pIVar98->TexUvScale = auVar116._0_8_;
  puVar67 = (uchar *)ImGui::MemAlloc((long)(iVar55 * pIVar98->TexWidth));
  pIVar98->TexPixelsAlpha8 = puVar67;
  memset(puVar67,0,(long)pIVar98->TexHeight * (long)pIVar98->TexWidth);
  uVar100 = 0;
  puVar67 = pIVar98->TexPixelsAlpha8;
  lVar62 = (long)local_498;
  local_278 = pshuflw(ZEXT416(uVar86),ZEXT416(uVar86),0);
  local_2f0 = puVar67 + 1;
  while( true ) {
    iVar55 = (int)uVar100;
    if (src_tmp_array.Size <= iVar55) break;
    local_300 = ImVector<ImFontConfig>::operator[](pIVar84,iVar55);
    local_2f8 = uVar100;
    pIVar59 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar55);
    if (pIVar59->GlyphsCount != 0) {
      psVar64 = pIVar59->Rects;
      bVar103 = true;
      lVar101 = 0;
      local_2e8 = psVar64;
      while( true ) {
        uVar114 = 0x80000000;
        uVar113 = 0x80000000;
        uVar111 = 0x80000000;
        if (!bVar103) break;
        fVar105 = (pIVar59->PackRange).font_size;
        if (fVar105 <= 0.0) {
          uVar71 = *(ushort *)((pIVar59->FontInfo).data + (long)(pIVar59->FontInfo).head + 0x12);
          local_248 = -fVar105 / (float)(ushort)(uVar71 << 8 | uVar71 >> 8);
        }
        else {
          local_248 = stbtt_ScaleForPixelHeight(&pIVar59->FontInfo,fVar105);
          uVar111 = extraout_var._0_4_;
          uVar113 = extraout_var._4_4_;
          uVar114 = extraout_var._8_4_;
        }
        uVar100._0_1_ = (pIVar59->PackRange).h_oversample;
        uVar21 = (pIVar59->PackRange).v_oversample;
        uVar22 = *(undefined6 *)&(pIVar59->PackRange).field_0x22;
        uVar100._1_7_ = CONCAT61(uVar22,uVar21);
        auVar27._8_6_ = 0;
        auVar27._0_8_ = uVar100;
        auVar27[0xe] = (char)((uint6)uVar22 >> 0x28);
        auVar29._8_4_ = 0;
        auVar29._0_8_ = uVar100;
        auVar29[0xc] = (char)((uint6)uVar22 >> 0x20);
        auVar29._13_2_ = auVar27._13_2_;
        auVar30._8_4_ = 0;
        auVar30._0_8_ = uVar100;
        auVar30._12_3_ = auVar29._12_3_;
        auVar31._8_2_ = 0;
        auVar31._0_8_ = uVar100;
        auVar31[10] = (char)((uint6)uVar22 >> 0x18);
        auVar31._11_4_ = auVar30._11_4_;
        auVar32._8_2_ = 0;
        auVar32._0_8_ = uVar100;
        auVar32._10_5_ = auVar31._10_5_;
        auVar33[8] = (char)((uint6)uVar22 >> 0x10);
        auVar33._0_8_ = uVar100;
        auVar33._9_6_ = auVar32._9_6_;
        auVar38._7_8_ = 0;
        auVar38._0_7_ = auVar33._8_7_;
        cVar110 = (char)((uint6)uVar22 >> 8);
        Var39 = CONCAT81(SUB158(auVar38 << 0x40,7),cVar110);
        auVar44._9_6_ = 0;
        auVar44._0_9_ = Var39;
        cVar109 = (char)uVar22;
        auVar34[4] = cVar109;
        auVar34._0_4_ = (uint)uVar100;
        auVar34._5_10_ = SUB1510(auVar44 << 0x30,5);
        auVar40._11_4_ = 0;
        auVar40._0_11_ = auVar34._4_11_;
        auVar41._1_12_ = SUB1512(auVar40 << 0x20,3);
        auVar41[0] = uVar21;
        uVar71 = CONCAT11(0,(undefined1)uVar100);
        auVar35._2_13_ = auVar41;
        auVar35._0_2_ = uVar71;
        uVar72 = auVar41._0_2_;
        sVar25 = -auVar34._4_2_;
        uVar112 = (ushort)Var39;
        sVar26 = -uVar112;
        auVar28._10_2_ = 0;
        auVar28._0_10_ = auVar35._0_10_;
        auVar28._12_2_ = uVar112;
        uVar46 = CONCAT42(auVar28._10_4_,auVar34._4_2_);
        auVar42._6_8_ = 0;
        auVar42._0_6_ = uVar46;
        auVar107._0_4_ = (float)uVar71;
        auVar107._4_4_ = (float)(int)CONCAT82(SUB148(auVar42 << 0x40,6),uVar72);
        auVar107._8_4_ = (float)(int)uVar46;
        auVar107._12_4_ = (float)uVar112;
        local_268 = divps(_DAT_00178c10,auVar107);
        auVar125[0] = -((undefined1)uVar100 == 0);
        auVar125[1] = -((undefined1)uVar100 == 0);
        auVar125[2] = -((undefined1)uVar100 == 0);
        auVar125[3] = -((undefined1)uVar100 == 0);
        auVar125[4] = -(uVar21 == '\0');
        auVar125[5] = -(uVar21 == '\0');
        auVar125[6] = -(uVar21 == '\0');
        auVar125[7] = -(uVar21 == '\0');
        auVar125[8] = -(cVar109 == '\0');
        auVar125[9] = -(cVar109 == '\0');
        auVar125[10] = -(cVar109 == '\0');
        auVar125[0xb] = -(cVar109 == '\0');
        auVar125[0xc] = -(cVar110 == '\0');
        auVar125[0xd] = -(cVar110 == '\0');
        auVar125[0xe] = -(cVar110 == '\0');
        auVar125[0xf] = -(cVar110 == '\0');
        Var45 = CONCAT64(CONCAT42(CONCAT22(sVar26,sVar26),sVar25),CONCAT22(sVar25,sVar26));
        auVar43._4_8_ = (long)((unkuint10)Var45 >> 0x10);
        auVar43._2_2_ = 1 - uVar72;
        auVar43._0_2_ = 1 - uVar72;
        auVar117._0_4_ = (float)(int)(short)(1 - uVar71);
        auVar117._4_4_ = (float)(auVar43._0_4_ >> 0x10);
        auVar117._8_4_ = (float)((int)((unkuint10)Var45 >> 0x10) >> 0x10);
        auVar117._12_4_ = (float)(int)sVar26;
        local_298._0_4_ = local_248 * auVar107._0_4_;
        local_298._4_4_ = local_248 * auVar107._4_4_;
        local_298._8_4_ = local_248 * auVar107._8_4_;
        local_298._12_4_ = local_248 * auVar107._12_4_;
        auVar108._0_4_ = auVar107._0_4_ + auVar107._0_4_;
        auVar108._4_4_ = auVar107._4_4_ + auVar107._4_4_;
        auVar108._8_4_ = auVar107._8_4_ + auVar107._8_4_;
        auVar108._12_4_ = auVar107._12_4_ + auVar107._12_4_;
        local_258 = divps(auVar117,auVar108);
        local_258 = ~auVar125 & local_258;
        lVar101 = (long)(int)lVar101;
        fVar105 = local_298._4_4_;
        if ((float)local_298._0_4_ <= local_298._4_4_) {
          fVar105 = (float)local_298._0_4_;
        }
        local_3ec = (0.35 / fVar105) * (0.35 / fVar105);
        local_320 = uVar100 & 0xff;
        local_328 = (ulong)((uint)uVar100._1_7_ & 0xff);
        uVar86 = (uint)uVar100 & 0xff;
        uVar100 = CONCAT44(local_298._4_4_,local_298._0_4_);
        auVar123._0_8_ = uVar100 ^ 0x8000000000000000;
        auVar123._8_4_ = local_298._0_4_;
        auVar123._12_4_ = -local_298._4_4_;
        lVar88 = 0;
        local_2a8 = local_298._4_4_;
        fStack_2a4 = local_298._4_4_;
        fStack_2a0 = local_298._4_4_;
        fStack_29c = local_298._4_4_;
        local_288 = auVar123;
        uStack_244 = uVar111;
        uStack_240 = uVar113;
        uStack_23c = uVar114;
LAB_00150ccf:
        fVar105 = auVar123._0_4_;
        if (lVar88 < (pIVar59->PackRange).num_chars) {
          if (((psVar64[lVar101].was_packed != 0) && (psVar64[lVar101].w != 0)) &&
             (psVar64[lVar101].h != 0)) {
            piVar66 = (pIVar59->PackRange).array_of_unicode_codepoints;
            if (piVar66 == (int *)0x0) {
              iVar55 = (pIVar59->PackRange).first_unicode_codepoint_in_range + (int)lVar88;
            }
            else {
              iVar55 = piVar66[lVar88];
            }
            local_2c0 = (pIVar59->PackRange).chardata_for_range + lVar88;
            local_340 = lVar88;
            local_338 = lVar101;
            iVar85 = stbtt_FindGlyphIndex(&pIVar59->FontInfo,iVar55);
            psVar47 = psVar64 + lVar101;
            uVar2 = psVar47->w;
            uVar6 = psVar47->h;
            uVar7 = psVar47->x;
            uVar9 = psVar47->y;
            psVar47 = psVar64 + lVar101;
            psVar47->w = uVar2 - local_278._0_2_;
            psVar47->h = uVar6 - local_278._2_2_;
            psVar47->x = uVar7 + local_278._4_2_;
            psVar47->y = uVar9 + local_278._6_2_;
            puVar82 = (pIVar59->FontInfo).data;
            uVar71 = *(ushort *)(puVar82 + (long)(pIVar59->FontInfo).hhea + 0x22) << 8 |
                     *(ushort *)(puVar82 + (long)(pIVar59->FontInfo).hhea + 0x22) >> 8;
            iVar55 = (pIVar59->FontInfo).hmtx;
            lVar88 = (ulong)uVar71 * 4 + (long)iVar55 + -4;
            lVar96 = (ulong)uVar71 * 4 + (long)iVar55 + -3;
            if (iVar85 < (int)(uint)uVar71) {
              lVar88 = (long)(iVar85 * 4) + (long)iVar55;
              lVar96 = (long)(iVar85 * 4) + 1 + (long)iVar55;
            }
            bVar11 = puVar82[lVar88];
            bVar12 = puVar82[lVar96];
            auVar116 = local_278;
            stbtt_GetGlyphBitmapBoxSubpixel
                      (&pIVar59->FontInfo,iVar85,(float)local_298._0_4_,local_2a8,local_278._0_4_,
                       fVar105,&x0_1,&y0_1,&x1_1,&local_2b0);
            fVar127 = auVar116._0_4_;
            uVar71 = psVar64[lVar101].x;
            uVar112 = psVar64[lVar101].y;
            local_408 = (ulong)psVar64[lVar101].w;
            uVar15 = psVar64[lVar101].h;
            uVar99 = stbtt_GetGlyphShape(&pIVar59->FontInfo,iVar85,(stbtt_vertex **)&fdarrayoff);
            fVar78 = (float)(((int)local_408 - uVar86) + 1);
            stbtt_GetGlyphBitmapBoxSubpixel
                      (&pIVar59->FontInfo,iVar85,(float)local_298._0_4_,local_2a8,fVar127,fVar105,
                       &y1,&iy0,(int *)0x0,(int *)0x0);
            iVar55 = y1;
            local_46c = fVar78;
            if (fVar78 != 0.0) {
              uVar58 = ((uint)uVar15 - (uint)uVar72) + 1;
              if (uVar58 != 0) {
                local_408 = (ulong)((int)local_408 - uVar86);
                lVar88 = CONCAT44(uStack_414,fdarrayoff);
                local_348 = (ulong)(uint)iy0;
                uVar92 = 0;
                uVar100 = (ulong)uVar99;
                if ((int)uVar99 < 1) {
                  uVar100 = uVar92;
                }
                uVar74 = 0;
                for (; uVar100 * 0xe - uVar92 != 0; uVar92 = uVar92 + 0xe) {
                  uVar74 = (ulong)((int)uVar74 + (uint)(*(char *)(lVar88 + 0xc + uVar92) == '\x01'))
                  ;
                }
                if (((int)uVar74 != 0) &&
                   (ptr_00 = ImGui::MemAlloc(uVar74 * 4), ptr_00 != (void *)0x0)) {
                  local_420 = (stbtt__point *)0x0;
                  iVar85 = 0;
                  iVar57 = 0;
                  iVar56 = 0;
                  do {
                    if (iVar57 == 1) {
                      local_420 = (stbtt__point *)ImGui::MemAlloc((long)iVar56 << 3);
                      if (local_420 == (stbtt__point *)0x0) {
                        ImGui::MemFree((void *)0x0);
                        ImGui::MemFree(ptr_00);
                        break;
                      }
                    }
                    else if (iVar57 == 2) goto LAB_00151180;
                    b.data._0_4_ = 0;
                    fVar105 = 0.0;
                    fVar78 = 0.0;
                    uVar99 = 0xffffffff;
                    for (lVar96 = 0; uVar100 * 0xe - lVar96 != 0; lVar96 = lVar96 + 0xe) {
                      iVar56 = (int)b.data;
                      switch(*(undefined1 *)(lVar88 + 0xc + lVar96)) {
                      case 1:
                        if (-1 < (int)uVar99) {
                          *(int *)((long)ptr_00 + (ulong)uVar99 * 4) = (int)b.data - iVar85;
                        }
                        uVar99 = uVar99 + 1;
                        auVar116 = pshuflw(ZEXT416(*(uint *)(lVar88 + lVar96)),
                                           ZEXT416(*(uint *)(lVar88 + lVar96)),0x60);
                        fVar105 = (float)(auVar116._0_4_ >> 0x10);
                        fVar78 = (float)(auVar116._4_4_ >> 0x10);
                        iVar85 = (int)b.data;
                        iVar56 = (int)b.data + 1;
                        if (local_420 != (stbtt__point *)0x0) {
                          local_420[(int)b.data].x = fVar105;
                          local_420[(int)b.data].y = fVar78;
                        }
                        break;
                      case 2:
                        auVar116 = pshuflw(ZEXT416(*(uint *)(lVar88 + lVar96)),
                                           ZEXT416(*(uint *)(lVar88 + lVar96)),0x60);
                        fVar105 = (float)(auVar116._0_4_ >> 0x10);
                        fVar78 = (float)(auVar116._4_4_ >> 0x10);
                        iVar56 = (int)b.data + 1;
                        if (local_420 != (stbtt__point *)0x0) {
                          local_420[(int)b.data].x = fVar105;
                          local_420[(int)b.data].y = fVar78;
                        }
                        break;
                      case 3:
                        stbtt__tesselate_curve
                                  (local_420,(int *)&b,fVar105,fVar78,
                                   (float)(int)*(short *)(lVar88 + 4 + lVar96),
                                   (float)(int)*(short *)(lVar88 + 6 + lVar96),
                                   (float)(int)*(short *)(lVar88 + lVar96),
                                   (float)(int)*(short *)(lVar88 + 2 + lVar96),local_3ec,0);
                        goto LAB_00151102;
                      case 4:
                        stbtt__tesselate_cubic
                                  (local_420,(int *)&b,fVar105,fVar78,
                                   (float)(int)*(short *)(lVar88 + 4 + lVar96),
                                   (float)(int)*(short *)(lVar88 + 6 + lVar96),
                                   (float)(int)*(short *)(lVar88 + 8 + lVar96),
                                   (float)(int)*(short *)(lVar88 + 10 + lVar96),
                                   (float)(int)*(short *)(lVar88 + lVar96),
                                   (float)(int)*(short *)(lVar88 + 2 + lVar96),local_3ec,0);
LAB_00151102:
                        auVar116 = pshuflw(ZEXT416(*(uint *)(lVar88 + lVar96)),
                                           ZEXT416(*(uint *)(lVar88 + lVar96)),0x60);
                        fVar105 = (float)(auVar116._0_4_ >> 0x10);
                        fVar78 = (float)(auVar116._4_4_ >> 0x10);
                        iVar56 = (int)b.data;
                      }
                      b.data._0_4_ = iVar56;
                    }
                    *(int *)((long)ptr_00 + (long)(int)uVar99 * 4) = (int)b.data - iVar85;
                    iVar57 = iVar57 + 1;
                    iVar56 = (int)b.data;
                  } while( true );
                }
              }
            }
            goto LAB_00151d0b;
          }
          goto LAB_00152295;
        }
        bVar103 = false;
      }
      fVar105 = local_300->RasterizerMultiply;
      if ((fVar105 != 1.0) || (NAN(fVar105))) {
        ImFontAtlasBuildMultiplyCalcLookupTable((uchar *)&b,fVar105);
        piVar66 = &pIVar59->Rects->was_packed;
        for (iVar55 = 0; pIVar84 = local_480, iVar55 < pIVar59->GlyphsCount; iVar55 = iVar55 + 1) {
          if (*piVar66 != 0) {
            ImFontAtlasBuildMultiplyRectAlpha8
                      ((uchar *)&b,pIVar98->TexPixelsAlpha8,(uint)*(ushort *)(piVar66 + -1),
                       (uint)*(stbrp_coord *)((long)piVar66 + -2),(uint)*(ushort *)(piVar66 + -2),
                       (uint)*(stbrp_coord *)((long)piVar66 + -6),pIVar98->TexWidth);
          }
          piVar66 = piVar66 + 4;
        }
      }
      pIVar59->Rects = (stbrp_rect *)0x0;
    }
    uVar100 = (ulong)((int)local_2f8 + 1);
  }
  ImGui::MemFree(local_430);
  ImGui::MemFree(local_350);
  ImVector<stbrp_rect>::clear(&buf_rects);
  for (iVar55 = 0; iVar55 < src_tmp_array.Size; iVar55 = iVar55 + 1) {
    pIVar59 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar55);
    if (pIVar59->GlyphsCount != 0) {
      pIVar60 = ImVector<ImFontConfig>::operator[](local_480,iVar55);
      pIVar19 = pIVar60->DstFont;
      fVar105 = stbtt_ScaleForPixelHeight(&pIVar59->FontInfo,pIVar60->SizePixels);
      puVar67 = (pIVar59->FontInfo).data;
      lVar62 = (long)(pIVar59->FontInfo).hhea;
      uVar71 = *(ushort *)(puVar67 + lVar62 + 4);
      uVar71 = uVar71 << 8 | uVar71 >> 8;
      fVar78 = -1.0;
      if (0 < (short)uVar71) {
        fVar78 = 1.0;
      }
      uVar72 = *(ushort *)(puVar67 + lVar62 + 6);
      uVar72 = uVar72 << 8 | uVar72 >> 8;
      fVar127 = -1.0;
      if (0 < (short)uVar72) {
        fVar127 = 1.0;
      }
      ImFontAtlasBuildSetupFont
                (local_478,pIVar19,pIVar60,
                 (float)(int)((float)(int)(short)uVar71 * fVar105 + fVar78),
                 (float)(int)((float)(int)(short)uVar72 * fVar105 + fVar127));
      fVar105 = (pIVar60->GlyphOffset).x;
      fVar78 = (float)(int)(pIVar19->Ascent + 0.5) + (pIVar60->GlyphOffset).y;
      lVar62 = 0;
      for (lVar101 = 0; lVar101 < pIVar59->GlyphsCount; lVar101 = lVar101 + 1) {
        piVar66 = ImVector<int>::operator[](&pIVar59->GlyphsList,(int)lVar101);
        psVar65 = pIVar59->PackedChars;
        fVar127 = *(float *)((long)&psVar65->xadvance + lVar62);
        fVar106 = pIVar60->GlyphMaxAdvanceX;
        if (fVar127 <= pIVar60->GlyphMaxAdvanceX) {
          fVar106 = fVar127;
        }
        uVar86 = -(uint)(fVar127 < pIVar60->GlyphMinAdvanceX);
        fVar106 = (float)(uVar86 & (uint)pIVar60->GlyphMinAdvanceX | ~uVar86 & (uint)fVar106);
        if ((fVar127 != fVar106) || (fVar122 = fVar105, NAN(fVar127) || NAN(fVar106))) {
          fVar122 = (fVar106 - fVar127) * 0.5;
          if (pIVar60->PixelSnapH != false) {
            fVar122 = (float)(int)fVar122;
          }
          fVar122 = fVar122 + fVar105;
        }
        fVar120 = 1.0 / (float)local_478->TexHeight;
        fVar127 = 1.0 / (float)local_478->TexWidth;
        ImFont::AddGlyph(pIVar19,(ImWchar)*piVar66,
                         *(float *)((long)&psVar65->xoff + lVar62) + 0.0 + fVar122,
                         *(float *)((long)&psVar65->yoff + lVar62) + 0.0 + fVar78,
                         *(float *)((long)&psVar65->xoff2 + lVar62) + 0.0 + fVar122,
                         *(float *)((long)&psVar65->yoff2 + lVar62) + 0.0 + fVar78,
                         (float)*(ushort *)((long)&psVar65->x0 + lVar62) * fVar127,
                         (float)*(ushort *)((long)&psVar65->y0 + lVar62) * fVar120,
                         (float)*(ushort *)((long)&psVar65->x1 + lVar62) * fVar127,
                         (float)*(ushort *)((long)&psVar65->y1 + lVar62) * fVar120,fVar106);
        lVar62 = lVar62 + 0x1c;
      }
    }
    pIVar98 = local_478;
  }
  for (iVar55 = 0; iVar55 < src_tmp_array.Size; iVar55 = iVar55 + 1) {
    pIVar59 = ImVector<ImFontBuildSrcData>::operator[](&src_tmp_array,iVar55);
    ImFontBuildSrcData::~ImFontBuildSrcData(pIVar59);
  }
  ImFontAtlasBuildFinish(pIVar98);
  ImVector<stbtt_packedchar>::~ImVector(&buf_packedchars);
  ImVector<stbrp_rect>::~ImVector(&buf_rects);
LAB_00152657:
  bVar103 = iVar16 <= local_3f8;
  ImVector<ImFontBuildDstData>::~ImVector(&dst_tmp_array);
  ImVector<ImFontBuildSrcData>::~ImVector(&src_tmp_array);
  return bVar103;
LAB_00151180:
  if (local_420 != (stbtt__point *)0x0) {
    iVar85 = 0;
    for (uVar100 = 0; uVar74 != uVar100; uVar100 = uVar100 + 1) {
      iVar85 = iVar85 + *(int *)((long)ptr_00 + uVar100 * 4);
    }
    p = (stbtt__edge *)ImGui::MemAlloc((long)(iVar85 + 1) * 0x14);
    if (p != (stbtt__edge *)0x0) {
      iVar85 = 0;
      iVar56 = 0;
      for (uVar100 = 0; uVar100 != uVar74; uVar100 = uVar100 + 1) {
        iVar57 = *(int *)((long)ptr_00 + uVar100 * 4);
        uVar90 = (ulong)(iVar57 - 1);
        iVar95 = iVar57;
        for (uVar92 = 0; iVar94 = (int)uVar90, (long)uVar92 < (long)iVar95; uVar92 = uVar92 + 1) {
          fVar105 = local_420[(long)iVar85 + (long)iVar94].y;
          fVar78 = local_420[(long)iVar85 + uVar92].y;
          if ((fVar105 != fVar78) || (NAN(fVar105) || NAN(fVar78))) {
            iVar95 = (int)uVar92;
            if (fVar105 <= fVar78) {
              iVar95 = iVar94;
              iVar94 = (int)uVar92;
            }
            p[iVar56].invert = (uint)(fVar78 < fVar105);
            sVar4 = local_420[(long)iVar85 + (long)iVar94];
            sVar5 = local_420[(long)iVar85 + (long)iVar95];
            psVar97 = p + iVar56;
            psVar97->x0 = sVar4.x * local_288._0_4_ + 0.0;
            psVar97->y0 = sVar4.y * local_288._4_4_ + 0.0;
            psVar97->x1 = sVar5.x * local_288._8_4_ + 0.0;
            psVar97->y1 = sVar5.y * local_288._12_4_ + 0.0;
            iVar56 = iVar56 + 1;
            iVar95 = *(int *)((long)ptr_00 + uVar100 * 4);
          }
          uVar90 = uVar92 & 0xffffffff;
        }
        iVar85 = iVar57 + iVar85;
      }
      stbtt__sort_edges_quicksort(p,iVar56);
      psVar97 = p;
      for (uVar100 = 1; (long)uVar100 < (long)iVar56; uVar100 = uVar100 + 1) {
        uVar3 = p[uVar100].x0;
        uVar8 = p[uVar100].y0;
        b.cursor = p[uVar100].invert;
        uVar17 = p[uVar100].x1;
        uVar23 = p[uVar100].y1;
        psVar87 = psVar97;
        for (uVar92 = uVar100; 0 < (long)uVar92; uVar92 = uVar92 - 1) {
          if (psVar87->y0 <= (float)uVar8) goto LAB_00151337;
          psVar87[1].invert = psVar87->invert;
          fVar105 = psVar87->y0;
          fVar78 = psVar87->x1;
          fVar127 = psVar87->y1;
          psVar87[1].x0 = psVar87->x0;
          psVar87[1].y0 = fVar105;
          psVar87[1].x1 = fVar78;
          psVar87[1].y1 = fVar127;
          psVar87 = psVar87 + -1;
        }
        uVar92 = 0;
LAB_00151337:
        iVar85 = (int)uVar92;
        if (uVar100 != (uVar92 & 0xffffffff)) {
          p[iVar85].x0 = (float)uVar3;
          p[iVar85].y0 = (float)uVar8;
          p[iVar85].x1 = (float)uVar17;
          p[iVar85].y1 = (float)uVar23;
          p[iVar85].invert = b.cursor;
        }
        psVar97 = psVar97 + 1;
        b.data._0_4_ = uVar17;
        b.data._4_4_ = uVar23;
      }
      _charstrings = (stbtt__active_edge *)0x0;
      scanline = &b;
      if (0x3f < (int)local_408) {
        scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)(uint)local_46c * 8 + 4);
      }
      local_2d8 = (long)(int)local_46c;
      local_400 = (float *)((long)&scanline->data + local_2d8 * 4);
      p[iVar56].y0 = (float)(int)((int)local_348 + uVar58) + 1.0;
      local_2c8 = local_2d8 * 4;
      local_2d0 = (long)(int)local_408 * 4 + 8;
      local_40c = (float)(int)local_46c;
      uVar100 = 0;
      if ((int)local_46c < 1) {
        local_46c = 0.0;
      }
      local_2e0 = 0;
      if (0 < local_2d8) {
        local_2e0 = local_2d8;
      }
      uVar92 = (ulong)uVar58;
      if ((int)uVar58 < 1) {
        uVar92 = uVar100;
      }
      psVar81 = (stbtt__active_edge *)0x0;
      local_3f0 = 0;
      local_3c0 = (undefined8 *)0x0;
      uVar74 = local_348 & 0xffffffff;
      iVar85 = 0;
      local_330 = p;
      while (local_388 = (int)uVar92, iVar85 != local_388) {
        fVar105 = (float)(int)uVar74;
        fVar78 = fVar105 + 1.0;
        local_3f4 = iVar85;
        memset(scanline,0,local_2c8);
        memset(local_400,0,local_2d0);
        psVar69 = (stbtt__active_edge *)&charstrings;
        while (psVar75 = psVar69, psVar20 = psVar75->next, psVar20 != (stbtt__active_edge *)0x0) {
          psVar69 = psVar20;
          if (psVar20->ey <= fVar105) {
            psVar75->next = psVar20->next;
            if ((psVar20->direction == 0.0) && (!NAN(psVar20->direction))) {
              __assert_fail("z->direction",
                            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                            ,0xc63,
                            "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                           );
            }
            psVar20->direction = 0.0;
            psVar20->next = psVar81;
            psVar69 = psVar75;
            psVar81 = psVar20;
          }
        }
        local_2b8 = uVar100;
        bVar103 = (int)local_348 != 0;
        bVar104 = local_3f4 == 0;
        for (psVar97 = local_330; fVar127 = psVar97->y0, fVar127 <= fVar78; psVar97 = psVar97 + 1) {
          fVar106 = psVar97->y1;
          if ((fVar127 != fVar106) || (psVar69 = psVar81, NAN(fVar127) || NAN(fVar106))) {
            if (psVar81 == (stbtt__active_edge *)0x0) {
              if (local_3f0 == 0) {
                puVar68 = (undefined8 *)ImGui::MemAlloc(0x6408);
                if (puVar68 == (undefined8 *)0x0) {
                  __assert_fail("z != __null",
                                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                                ,0xad1,
                                "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                               );
                }
                *puVar68 = local_3c0;
                fVar127 = psVar97->y0;
                fVar106 = psVar97->y1;
                local_3f0 = 799;
              }
              else {
                local_3f0 = local_3f0 + -1;
                puVar68 = local_3c0;
              }
              psVar81 = (stbtt__active_edge *)(puVar68 + (long)local_3f0 * 4 + 1);
              psVar69 = (stbtt__active_edge *)0x0;
              local_3c0 = puVar68;
            }
            else {
              psVar69 = psVar81->next;
            }
            fVar122 = psVar97->x0;
            fVar120 = (psVar97->x1 - fVar122) / (fVar106 - fVar127);
            psVar81->fdx = fVar120;
            psVar81->fdy = (float)(-(uint)(fVar120 != 0.0) & (uint)(1.0 / fVar120));
            psVar81->fx = ((fVar105 - fVar127) * fVar120 + fVar122) - (float)iVar55;
            psVar81->direction = *(float *)(&DAT_0017e2ac + (ulong)(psVar97->invert == 0) * 4);
            psVar81->sy = fVar127;
            psVar81->ey = fVar106;
            psVar81->next = (stbtt__active_edge *)0x0;
            if (fVar106 < fVar105 && (bVar104 && bVar103)) {
              psVar81->ey = fVar105;
              fVar106 = fVar105;
            }
            if (fVar106 < fVar105) {
              __assert_fail("z->ey >= scan_y_top",
                            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                            ,0xc76,
                            "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                           );
            }
            psVar81->next = _charstrings;
            _charstrings = psVar81;
          }
          psVar81 = psVar69;
        }
        local_330 = psVar97;
        psVar69 = _charstrings;
        if (_charstrings != (stbtt__active_edge *)0x0) {
          for (; psVar69 != (stbtt__active_edge *)0x0; psVar69 = psVar69->next) {
            fVar127 = psVar69->ey;
            if (fVar127 < fVar105) {
              __assert_fail("e->ey >= y_top",
                            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                            ,0xba5,
                            "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                           );
            }
            fVar106 = psVar69->fx;
            auVar126._0_8_ = CONCAT44(0,fVar106);
            auVar126._8_8_ = 0;
            fVar122 = psVar69->fdx;
            if ((fVar122 != 0.0) || (NAN(fVar122))) {
              fVar120 = psVar69->sy;
              if (fVar78 < fVar120) {
                __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                              "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                              ,3000,
                              "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                             );
              }
              fVar128 = fVar122 + fVar106;
              fVar124 = (float)(~-(uint)(fVar105 < fVar120) & (uint)fVar106 |
                               (uint)((fVar120 - fVar105) * fVar122 + fVar106) &
                               -(uint)(fVar105 < fVar120));
              if ((((fVar124 < 0.0) ||
                   (fVar121 = (float)(~-(uint)(fVar127 < fVar78) & (uint)fVar128 |
                                     (uint)((fVar127 - fVar105) * fVar122 + fVar106) &
                                     -(uint)(fVar127 < fVar78)), fVar121 < 0.0)) ||
                  (local_40c <= fVar124)) || (local_40c <= fVar121)) {
                local_318 = auVar126;
                fVar127 = 0.0;
                while (local_46c != fVar127) {
                  fVar120 = (float)(int)fVar127;
                  fVar118 = (float)(int)((int)fVar127 + 1U);
                  fVar106 = local_318._0_4_;
                  fVar124 = (fVar120 - fVar106) / fVar122 + fVar105;
                  fVar121 = (fVar118 - fVar106) / fVar122 + fVar105;
                  if ((fVar120 <= fVar106) || (fVar128 <= fVar118)) {
                    if ((fVar120 <= fVar128) || (fVar106 <= fVar118)) {
                      fVar115 = fVar105;
                      if (((fVar120 <= fVar106) || (fVar128 <= fVar120)) &&
                         ((fVar120 <= fVar128 || (fVar106 <= fVar120)))) {
                        fVar124 = fVar105;
                        if (((fVar106 < fVar118) && (fVar118 < fVar128)) ||
                           ((fVar120 = fVar106, fVar128 < fVar118 && (fVar118 < fVar106)))) {
                          local_490 = CONCAT44(local_490._4_4_,fVar121);
                          goto LAB_001518ff;
                        }
                        goto LAB_001519b3;
                      }
                    }
                    else {
                      local_490 = CONCAT44(local_490._4_4_,fVar121);
                      stbtt__handle_clipped_edge
                                ((float *)scanline,(int)fVar127,psVar69,fVar106,fVar105,fVar118,
                                 fVar121);
                      fVar106 = fVar118;
                      fVar115 = (float)local_490;
                    }
                    stbtt__handle_clipped_edge
                              ((float *)scanline,(int)fVar127,psVar69,fVar106,fVar115,fVar120,
                               fVar124);
                  }
                  else {
                    local_490 = CONCAT44(local_490._4_4_,fVar121);
                    stbtt__handle_clipped_edge
                              ((float *)scanline,(int)fVar127,psVar69,fVar106,fVar105,fVar120,
                               fVar124);
                    fVar106 = fVar120;
                    fVar121 = (float)local_490;
LAB_001518ff:
                    stbtt__handle_clipped_edge
                              ((float *)scanline,(int)fVar127,psVar69,fVar106,fVar124,fVar118,
                               fVar121);
                    fVar120 = fVar118;
                    fVar124 = (float)local_490;
                  }
LAB_001519b3:
                  stbtt__handle_clipped_edge
                            ((float *)scanline,(int)fVar127,psVar69,fVar120,fVar124,fVar128,fVar78);
                  fVar127 = (float)((int)fVar127 + 1U);
                }
              }
              else {
                if (fVar120 <= fVar105) {
                  fVar120 = fVar105;
                }
                uVar99 = (uint)fVar124;
                if (fVar78 <= fVar127) {
                  fVar127 = fVar78;
                }
                uVar58 = (uint)fVar121;
                if (uVar99 == uVar58) {
                  if (((int)uVar99 < 0) || ((int)local_408 < (int)uVar99)) {
                    __assert_fail("x >= 0 && x < len",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                                  ,0xbd4,
                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                 );
                  }
                  uVar100 = (ulong)uVar99;
                  *(float *)((long)&scanline->data + uVar100 * 4) =
                       (((fVar121 - (float)(int)uVar99) + (fVar124 - (float)(int)uVar99)) * -0.5 +
                       1.0) * psVar69->direction * (fVar127 - fVar120) +
                       *(float *)((long)&scanline->data + uVar100 * 4);
                  fVar106 = (fVar127 - fVar120) * psVar69->direction;
                }
                else {
                  fVar122 = psVar69->fdy;
                  uVar73 = uVar99;
                  fVar118 = fVar124;
                  if (fVar121 < fVar124) {
                    fVar106 = fVar105 - fVar120;
                    fVar120 = (fVar105 - fVar127) + fVar78;
                    fVar122 = -fVar122;
                    uVar73 = uVar58;
                    uVar58 = uVar99;
                    fVar127 = fVar106 + fVar78;
                    fVar106 = fVar128;
                    fVar118 = fVar121;
                    fVar121 = fVar124;
                  }
                  iVar85 = uVar73 + 1;
                  fVar128 = ((float)iVar85 - fVar106) * fVar122 + fVar105;
                  fVar106 = psVar69->direction;
                  fVar124 = (fVar128 - fVar120) * fVar106;
                  *(float *)((long)&scanline->data + (long)(int)uVar73 * 4) =
                       (1.0 - ((fVar118 - (float)(int)uVar73) + 1.0) * 0.5) * fVar124 +
                       *(float *)((long)&scanline->data + (long)(int)uVar73 * 4);
                  uVar100 = (ulong)(int)uVar58;
                  for (lVar88 = (long)iVar85; lVar88 < (long)uVar100; lVar88 = lVar88 + 1) {
                    *(float *)((long)&scanline->data + lVar88 * 4) =
                         fVar122 * fVar106 * 0.5 + fVar124 +
                         *(float *)((long)&scanline->data + lVar88 * 4);
                    fVar124 = fVar124 + fVar122 * fVar106;
                  }
                  if (1.01 < ABS(fVar124)) {
                    __assert_fail("fabsf(area) <= 1.01f",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                                  ,0xbfb,
                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                 );
                  }
                  *(float *)((long)&scanline->data + uVar100 * 4) =
                       (fVar127 - (fVar122 * (float)(int)(uVar58 - iVar85) + fVar128)) *
                       (((fVar121 - (float)(int)uVar58) + 0.0) * -0.5 + 1.0) * fVar106 + fVar124 +
                       *(float *)((long)&scanline->data + uVar100 * 4);
                  fVar106 = (fVar127 - fVar120) * fVar106;
                }
                local_400[uVar100 + 1] = fVar106 + local_400[uVar100 + 1];
              }
            }
            else if (fVar106 < local_40c) {
              if (0.0 <= fVar106) {
                local_318 = auVar126;
                stbtt__handle_clipped_edge
                          ((float *)scanline,(int)fVar106,psVar69,fVar106,fVar105,fVar106,fVar78);
                iVar85 = (int)fVar106 + 1;
                auVar119 = local_318;
              }
              else {
                iVar85 = 0;
                auVar119._8_8_ = 0;
                auVar119._0_8_ = auVar126._0_8_;
              }
              stbtt__handle_clipped_edge
                        (local_400,iVar85,psVar69,auVar119._0_4_,fVar105,auVar119._0_4_,fVar78);
            }
          }
        }
        fVar105 = 0.0;
        uVar100 = local_2b8 & 0xffffffff;
        lVar88 = local_2e0;
        psVar76 = scanline;
        while (bVar103 = lVar88 != 0, lVar88 = lVar88 + -1, bVar103) {
          fVar105 = fVar105 + *(float *)((long)&psVar76->data + local_2d8 * 4);
          iVar85 = (int)(ABS(*(float *)&psVar76->data + fVar105) * 255.0 + 0.5);
          if (0xfe < iVar85) {
            iVar85 = 0xff;
          }
          puVar67[(long)(int)uVar100 + (ulong)uVar112 * lVar62 + (ulong)uVar71] = (uchar)iVar85;
          uVar100 = (ulong)((int)uVar100 + 1);
          psVar76 = (stbtt__buf *)((long)&psVar76->data + 4);
        }
        psVar70 = &charstrings;
        while (psVar70 = *(stbtt_uint32 **)psVar70, psVar70 != (stbtt_uint32 *)0x0) {
          psVar70[2] = (stbtt_uint32)((float)psVar70[3] + (float)psVar70[2]);
        }
        uVar74 = (ulong)((int)uVar74 + 1);
        uVar100 = (ulong)(uint)((int)local_2b8 + local_498);
        iVar85 = local_3f4 + 1;
      }
      while (local_3c0 != (undefined8 *)0x0) {
        puVar68 = (undefined8 *)*local_3c0;
        ImGui::MemFree(local_3c0);
        local_3c0 = puVar68;
      }
      if (scanline != &b) {
        ImGui::MemFree(scanline);
      }
      ImGui::MemFree(p);
    }
    ImGui::MemFree(ptr_00);
    ImGui::MemFree(local_420);
  }
LAB_00151d0b:
  ImGui::MemFree((void *)CONCAT44(uStack_414,fdarrayoff));
  uVar58._0_2_ = psVar64[lVar101].x;
  uVar58._2_2_ = psVar64[lVar101].y;
  uVar99._0_2_ = psVar64[lVar101].w;
  uVar99._2_2_ = psVar64[lVar101].h;
  if (1 < (byte)local_320) {
    lVar88 = (long)(int)((uVar58 >> 0x10) * local_498);
    puVar82 = puVar67 + lVar88 + (ulong)(ushort)(undefined2)uVar58;
    iVar55 = (uVar99 & 0xffff) - uVar86;
    b.data._0_4_ = 0;
    b.data._4_4_ = 0;
    if (iVar55 < 0) {
      iVar55 = -1;
    }
    uVar100 = (long)iVar55 + 1;
    puVar102 = local_2f0 + lVar88 + (ulong)(ushort)(undefined2)uVar58 + (long)iVar55;
    for (uVar58 = 0; uVar92 = local_320, uVar58 != uVar99 >> 0x10; uVar58 = uVar58 + 1) {
      memset(&b,0,local_320);
      puVar91 = puVar102;
      uVar74 = uVar100;
      switch((int)uVar92) {
      case 2:
        uVar92 = 0;
        for (uVar90 = 0; uVar100 != uVar90; uVar90 = uVar90 + 1) {
          bVar13 = puVar82[uVar90];
          bVar14 = *(byte *)((long)&b.data + (ulong)((uint)uVar90 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar90 + 2 & 7)) = bVar13;
          uVar73 = (int)uVar92 + ((uint)bVar13 - (uint)bVar14);
          uVar92 = (ulong)uVar73;
          puVar82[uVar90] = (uchar)(uVar73 >> 1);
        }
        break;
      case 3:
        uVar92 = 0;
        for (uVar90 = 0; uVar100 != uVar90; uVar90 = uVar90 + 1) {
          bVar13 = puVar82[uVar90];
          bVar14 = *(byte *)((long)&b.data + (ulong)((uint)uVar90 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar90 + 3 & 7)) = bVar13;
          uVar92 = (ulong)((int)uVar92 + ((uint)bVar13 - (uint)bVar14));
          puVar82[uVar90] = (uchar)(uVar92 / 3);
        }
        break;
      case 4:
        uVar92 = 0;
        for (uVar90 = 0; uVar100 != uVar90; uVar90 = uVar90 + 1) {
          bVar13 = puVar82[uVar90];
          uVar89 = (ulong)((uint)uVar90 & 7);
          bVar14 = *(byte *)((long)&b.data + uVar89);
          *(byte *)((long)&b.data + (uVar89 ^ 4)) = bVar13;
          uVar73 = (int)uVar92 + ((uint)bVar13 - (uint)bVar14);
          uVar92 = (ulong)uVar73;
          puVar82[uVar90] = (uchar)(uVar73 >> 2);
        }
        break;
      case 5:
        uVar92 = 0;
        for (uVar90 = 0; uVar100 != uVar90; uVar90 = uVar90 + 1) {
          bVar13 = puVar82[uVar90];
          bVar14 = *(byte *)((long)&b.data + (ulong)((uint)uVar90 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar90 + 5 & 7)) = bVar13;
          uVar92 = (ulong)((int)uVar92 + ((uint)bVar13 - (uint)bVar14));
          puVar82[uVar90] = (uchar)(uVar92 / 5);
        }
        break;
      default:
        uVar92 = 0;
        for (uVar90 = 0; uVar100 != uVar90; uVar90 = uVar90 + 1) {
          bVar13 = puVar82[uVar90];
          bVar14 = *(byte *)((long)&b.data + (ulong)((uint)uVar90 & 7));
          *(byte *)((long)&b.data + (ulong)(uVar86 + (uint)uVar90 & 7)) = bVar13;
          uVar73 = (int)uVar92 + ((uint)bVar13 - (uint)bVar14);
          uVar92 = (ulong)uVar73;
          puVar82[uVar90] = (uchar)(uVar73 / uVar86);
        }
      }
      for (; uVar74 < (uVar99 & 0xffff); uVar74 = uVar74 + 1) {
        if (*puVar91 != '\0') {
          __assert_fail("pixels[i] == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                        ,0xf41,
                        "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)");
        }
        uVar73 = (int)uVar92 - (uint)*(byte *)((long)&b.data + (ulong)((uint)uVar74 & 7));
        uVar92 = (ulong)uVar73;
        *puVar91 = (uchar)(uVar73 / uVar86);
        puVar91 = puVar91 + 1;
      }
      puVar82 = puVar82 + lVar62;
      puVar102 = puVar102 + lVar62;
    }
    uVar58._0_2_ = psVar64[lVar101].x;
    uVar58._2_2_ = psVar64[lVar101].y;
    uVar99._0_2_ = psVar64[lVar101].w;
    uVar99._2_2_ = psVar64[lVar101].h;
  }
  if (1 < (byte)local_328) {
    lVar88 = (long)(int)((uVar58 >> 0x10) * local_498);
    pbVar83 = puVar67 + lVar88 + (ulong)(ushort)uVar58;
    uVar71 = (ushort)(uVar99 >> 0x10);
    b.data._0_4_ = 0;
    b.data._4_4_ = 0;
    local_448 = (uint)uVar72;
    iVar55 = uVar71 - local_448;
    if (iVar55 < 0) {
      iVar55 = -1;
    }
    uVar100 = (long)iVar55 + 1;
    puVar82 = puVar67 + lVar62 * uVar100 + lVar88 + (ulong)(ushort)uVar58;
    for (uVar58 = 0; uVar92 = local_328, uVar58 != (uVar99 & 0xffff); uVar58 = uVar58 + 1) {
      memset(&b,0,local_328);
      puVar102 = puVar82;
      uVar74 = uVar100;
      switch((int)uVar92) {
      case 2:
        uVar92 = 0;
        pbVar93 = pbVar83;
        for (uVar90 = 0; uVar100 != uVar90; uVar90 = uVar90 + 1) {
          bVar13 = *pbVar93;
          bVar14 = *(byte *)((long)&b.data + (ulong)((uint)uVar90 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar90 + 2 & 7)) = bVar13;
          uVar73 = (int)uVar92 + ((uint)bVar13 - (uint)bVar14);
          uVar92 = (ulong)uVar73;
          *pbVar93 = (byte)(uVar73 >> 1);
          pbVar93 = pbVar93 + lVar62;
        }
        break;
      case 3:
        uVar92 = 0;
        pbVar93 = pbVar83;
        for (uVar90 = 0; uVar100 != uVar90; uVar90 = uVar90 + 1) {
          bVar13 = *pbVar93;
          bVar14 = *(byte *)((long)&b.data + (ulong)((uint)uVar90 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar90 + 3 & 7)) = bVar13;
          uVar92 = (ulong)((int)uVar92 + ((uint)bVar13 - (uint)bVar14));
          *pbVar93 = (byte)(uVar92 / 3);
          pbVar93 = pbVar93 + lVar62;
        }
        break;
      case 4:
        uVar92 = 0;
        pbVar93 = pbVar83;
        for (uVar90 = 0; uVar100 != uVar90; uVar90 = uVar90 + 1) {
          bVar13 = *pbVar93;
          uVar89 = (ulong)((uint)uVar90 & 7);
          bVar14 = *(byte *)((long)&b.data + uVar89);
          *(byte *)((long)&b.data + (uVar89 ^ 4)) = bVar13;
          uVar73 = (int)uVar92 + ((uint)bVar13 - (uint)bVar14);
          uVar92 = (ulong)uVar73;
          *pbVar93 = (byte)(uVar73 >> 2);
          pbVar93 = pbVar93 + lVar62;
        }
        break;
      case 5:
        uVar92 = 0;
        pbVar93 = pbVar83;
        for (uVar90 = 0; uVar100 != uVar90; uVar90 = uVar90 + 1) {
          bVar13 = *pbVar93;
          bVar14 = *(byte *)((long)&b.data + (ulong)((uint)uVar90 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar90 + 5 & 7)) = bVar13;
          uVar92 = (ulong)((int)uVar92 + ((uint)bVar13 - (uint)bVar14));
          *pbVar93 = (byte)(uVar92 / 5);
          pbVar93 = pbVar93 + lVar62;
        }
        break;
      default:
        uVar92 = 0;
        pbVar93 = pbVar83;
        for (uVar90 = 0; uVar100 != uVar90; uVar90 = uVar90 + 1) {
          bVar13 = *pbVar93;
          bVar14 = *(byte *)((long)&b.data + (ulong)((uint)uVar90 & 7));
          *(byte *)((long)&b.data + (ulong)((uint)uVar72 + (uint)uVar90 & 7)) = bVar13;
          uVar73 = (int)uVar92 + ((uint)bVar13 - (uint)bVar14);
          uVar92 = (ulong)uVar73;
          *pbVar93 = (byte)(uVar73 / uVar72);
          pbVar93 = pbVar93 + lVar62;
        }
      }
      for (; uVar74 < uVar71; uVar74 = uVar74 + 1) {
        if (*puVar102 != '\0') {
          __assert_fail("pixels[i*stride_in_bytes] == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                        ,0xf7f,
                        "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)");
        }
        uVar73 = (int)uVar92 - (uint)*(byte *)((long)&b.data + (ulong)((uint)uVar74 & 7));
        uVar92 = (ulong)uVar73;
        *puVar102 = (uchar)(uVar73 / local_448);
        puVar102 = puVar102 + lVar62;
      }
      pbVar83 = pbVar83 + 1;
      puVar82 = puVar82 + 1;
    }
    uVar58._0_2_ = psVar64[lVar101].x;
    uVar58._2_2_ = psVar64[lVar101].y;
    uVar99._0_2_ = psVar64[lVar101].w;
    uVar99._2_2_ = psVar64[lVar101].h;
  }
  local_2c0->x0 = (short)uVar58;
  local_2c0->y0 = (short)(uVar58 >> 0x10);
  uVar71 = (ushort)(uVar99 >> 0x10);
  local_2c0->x1 = (short)uVar58 + (short)uVar99;
  local_2c0->y1 = (short)(uVar58 >> 0x10) + uVar71;
  local_2c0->xadvance = (float)(int)(short)((ushort)bVar11 * 0x100 + (ushort)bVar12) * local_248;
  local_2c0->xoff = (float)x0_1 * local_268._0_4_ + local_258._0_4_;
  local_2c0->yoff = (float)y0_1 * local_268._4_4_ + local_258._4_4_;
  local_2c0->xoff2 = (float)(int)((uVar99 & 0xffff) + x0_1) * local_268._0_4_ + local_258._0_4_;
  local_2c0->yoff2 = (float)(int)((uint)uVar71 + y0_1) * local_268._4_4_ + local_258._4_4_;
  lVar88 = local_340;
  lVar101 = local_338;
  pIVar84 = local_480;
  psVar64 = local_2e8;
  pIVar98 = local_478;
  auVar123 = local_258;
LAB_00152295:
  lVar101 = lVar101 + 1;
  lVar88 = lVar88 + 1;
  goto LAB_00150ccf;
}

Assistant:

bool    ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
        if (src_tmp.DstIndex == -1)
            return false;

        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096*0.7f) ? 4096 : (surface_sqrt >= 2048*0.7f) ? 2048 : (surface_sqrt >= 1024*0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont; // We can have multiple input fonts writing into a same destination font (when using MergeMode=true)

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];

            const float char_advance_x_org = pc.xadvance;
            const float char_advance_x_mod = ImClamp(char_advance_x_org, cfg.GlyphMinAdvanceX, cfg.GlyphMaxAdvanceX);
            float char_off_x = font_off_x;
            if (char_advance_x_org != char_advance_x_mod)
                char_off_x += cfg.PixelSnapH ? ImFloor((char_advance_x_mod - char_advance_x_org) * 0.5f) : (char_advance_x_mod - char_advance_x_org) * 0.5f;

            // Register glyph
            stbtt_aligned_quad q;
            float dummy_x = 0.0f, dummy_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &dummy_x, &dummy_y, &q, 0);
            dst_font->AddGlyph((ImWchar)codepoint, q.x0 + char_off_x, q.y0 + font_off_y, q.x1 + char_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, char_advance_x_mod);
        }
    }

    // Cleanup temporary (ImVector doesn't honor destructor)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
        src_tmp_array[src_i].~ImFontBuildSrcData();

    ImFontAtlasBuildFinish(atlas);
    return true;
}